

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.h
# Opt level: O3

void __thiscall HEkkDualRow::~HEkkDualRow(HEkkDualRow *this)

{
  pointer piVar1;
  pointer ppVar2;
  pointer pdVar3;
  
  piVar1 = (this->alt_workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  ppVar2 = (this->sorted_workData).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (ppVar2 != (pointer)0x0) {
    operator_delete(ppVar2);
  }
  ppVar2 = (this->original_workData).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (ppVar2 != (pointer)0x0) {
    operator_delete(ppVar2);
  }
  piVar1 = (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  ppVar2 = (this->workData).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (ppVar2 != (pointer)0x0) {
    operator_delete(ppVar2);
  }
  pdVar3 = (this->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar1 = (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->freeList)._M_t);
  return;
}

Assistant:

HEkkDualRow(HEkk& simplex) : ekk_instance_(simplex) {}